

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayleigh_dist.hpp
# Opt level: O0

result_type_conflict3 * __thiscall
trng::rayleigh_dist<long_double>::icdf(rayleigh_dist<long_double> *this,result_type_conflict3 x)

{
  int *piVar1;
  result_type_conflict3 *prVar2;
  result_type_conflict3 *extraout_RAX;
  param_type *in_RSI;
  result_type_conflict3 *in_RDI;
  double __x;
  longdouble in_stack_00000008;
  undefined8 in_stack_ffffffffffffffa2;
  
  if ((in_stack_00000008 < (longdouble)0) || ((longdouble)1 < in_stack_00000008)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    prVar2 = (result_type_conflict3 *)std::numeric_limits<long_double>::quiet_NaN();
  }
  else {
    param_type::nu(in_RDI,in_RSI);
    math::ln((longdouble)
             CONCAT82(in_stack_ffffffffffffffa2,
                      (short)((unkuint10)((longdouble)1 - in_stack_00000008) >> 0x40)));
    std::sqrt(__x);
    prVar2 = extraout_RAX;
  }
  return prVar2;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      return P.nu() * math::sqrt(-2 * math::ln(1 - x));
    }